

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary.c
# Opt level: O0

bndCond createBoundCond(int wl,int wr,int wt,int wb)

{
  bndCond bVar1;
  int wb_local;
  int wt_local;
  int wr_local;
  int wl_local;
  bndCond bCond;
  
  wl_local._0_1_ = (char)wl;
  wr_local._0_1_ = (byte)wr;
  wt_local._0_1_ = (byte)wt;
  wb_local._0_1_ = (byte)wb;
  bVar1._1_7_ = bCond._1_7_;
  bVar1._0_1_ = (char)wl_local << 6 | ((byte)wr_local & 3) << 2 | (byte)wt_local & 3 |
                ((byte)wb_local & 3) << 4;
  bVar1.FLAG = (char **)0x0;
  return bVar1;
}

Assistant:

bndCond createBoundCond (int wl, int wr, int wt, int wb)
{
	bndCond bCond;
	bCond.wl = wl;
	bCond.wr = wr;
	bCond.wt = wt;
	bCond.wb = wb;
	bCond.FLAG = NULL;
	return bCond;
}